

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall
iu_UtilTest_x_iutest_x_FindTypedTest_Test::Body(iu_UtilTest_x_iutest_x_FindTypedTest_Test *this)

{
  char *pcVar1;
  int iVar2;
  UnitTest *pUVar3;
  TestSuite *pTVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  AssertionResult iutest_ar;
  TestSuite *in_stack_fffffffffffffdb8;
  _Alloc_hider in_stack_fffffffffffffdc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  bool local_220;
  TestSuite *local_218;
  AssertionHelper local_210;
  undefined1 local_1e0 [432];
  
  pUVar3 = iutest::UnitTest::instance();
  uVar6 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar4 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7];
      bVar5 = true;
      if ((((pTVar4 != (TestSuite *)0x0) &&
           (pcVar1 = (pTVar4->m_testsuite_name)._M_dataplus._M_p, pcVar1 != (char *)0x0)) &&
          (iVar2 = strncmp(pcVar1,"UnitTest",8), iVar2 == 0)) && (pcVar1[8] == '/')) {
        bVar5 = false;
        local_218 = pTVar4;
      }
    } while ((bVar5) && (uVar7 = uVar7 + 1, (uVar6 & 0x7fffffff) != uVar7));
  }
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffdc0._M_p,in_stack_fffffffffffffdb8);
  if (local_220 == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,in_stack_fffffffffffffdc0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdbf);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x5f;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdc0._M_p != &local_230) {
    operator_delete(in_stack_fffffffffffffdc0._M_p,local_230._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar6 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar6 < 1) {
    pTVar4 = (TestSuite *)0x0;
  }
  else {
    uVar7 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar4 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar7];
      bVar5 = true;
      if (((pTVar4 != (TestSuite *)0x0) &&
          (pcVar1 = (pTVar4->m_testsuite_name)._M_dataplus._M_p, pcVar1 != (char *)0x0)) &&
         ((iVar2 = strncmp(pcVar1,"TypedTest",9), iVar2 == 0 && (pcVar1[9] == '/')))) {
        bVar5 = false;
        local_218 = pTVar4;
      }
      pTVar4 = local_218;
      if (!bVar5) goto LAB_00134934;
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
    pTVar4 = (TestSuite *)0x0;
  }
LAB_00134934:
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            ((AssertionResult *)&stack0xfffffffffffffdc0,"(find_testsuite)",pTVar4);
  if (local_220 == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,in_stack_fffffffffffffdc0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdbf);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 99;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdc0._M_p != &local_230) {
    operator_delete(in_stack_fffffffffffffdc0._M_p,local_230._M_allocated_capacity + 1);
  }
  pTVar4 = iuutil::FindTypedTestSuite("TypedTest",pTVar4);
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            ((AssertionResult *)&stack0xfffffffffffffdc0,"(find_testsuite)",pTVar4);
  if (local_220 == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,in_stack_fffffffffffffdc0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdbf);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x65;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdc0._M_p != &local_230) {
    operator_delete(in_stack_fffffffffffffdc0._M_p,local_230._M_allocated_capacity + 1);
  }
  iuutil::FindTypedTestSuite("TypedTest",pTVar4);
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffdc0._M_p,in_stack_fffffffffffffdb8);
  if (local_220 == false) {
    memset((iu_global_format_stringstream *)local_1e0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,in_stack_fffffffffffffdc0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdbf);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x67;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_1e0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdc0._M_p != &local_230) {
    operator_delete(in_stack_fffffffffffffdc0._M_p,local_230._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_P(ParamTest, Test)
{
}